

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# eigen.h
# Opt level: O2

handle pybind11::detail::type_caster<Eigen::Matrix<double,1,1,1,1,1>,void>::
       cast_impl<Eigen::Matrix<double,1,1,1,1,1>const>
                 (Matrix<double,_1,_1,_1,_1,_1> *src,return_value_policy policy,handle parent)

{
  Matrix<double,_1,_1,_1,_1,_1> *pMVar1;
  handle hVar2;
  cast_error *this;
  undefined7 in_register_00000031;
  object local_18;
  
  switch(CONCAT71(in_register_00000031,policy) & 0xffffffff) {
  case 0:
  case 2:
    break;
  case 1:
  case 5:
    local_18.super_handle.m_ptr = (handle)&_Py_NoneStruct;
    __Py_NoneStruct = __Py_NoneStruct + 1;
    hVar2 = eigen_ref_array<pybind11::detail::EigenProps<Eigen::Matrix<double,1,1,1,1,1>>,Eigen::Matrix<double,1,1,1,1,1>const>
                      (src,(PyObject *)&_Py_NoneStruct);
    pybind11::object::~object(&local_18);
    return (handle)hVar2.m_ptr;
  case 3:
    hVar2 = eigen_array_cast<pybind11::detail::EigenProps<Eigen::Matrix<double,1,1,1,1,1>>>
                      (src,(handle)0x0,true);
    return (handle)hVar2.m_ptr;
  case 4:
    pMVar1 = (Matrix<double,_1,_1,_1,_1,_1> *)Eigen::internal::conditional_aligned_malloc<false>(8);
    (pMVar1->super_PlainObjectBase<Eigen::Matrix<double,_1,_1,_1,_1,_1>_>).m_storage.m_data.array[0]
         = (src->super_PlainObjectBase<Eigen::Matrix<double,_1,_1,_1,_1,_1>_>).m_storage.m_data.
           array[0];
    src = pMVar1;
    break;
  case 6:
    hVar2 = eigen_ref_array<pybind11::detail::EigenProps<Eigen::Matrix<double,1,1,1,1,1>>,Eigen::Matrix<double,1,1,1,1,1>const>
                      (src,parent);
    return (handle)hVar2.m_ptr;
  default:
    this = (cast_error *)__cxa_allocate_exception(0x10);
    cast_error::runtime_error(this,"unhandled return_value_policy: should not happen!");
    __cxa_throw(this,&cast_error::typeinfo,std::runtime_error::~runtime_error);
  }
  hVar2 = eigen_encapsulate<pybind11::detail::EigenProps<Eigen::Matrix<double,1,1,1,1,1>>,Eigen::Matrix<double,1,1,1,1,1>const,void>
                    (src);
  return (handle)hVar2.m_ptr;
}

Assistant:

static handle cast_impl(CType *src, return_value_policy policy, handle parent) {
        switch (policy) {
            case return_value_policy::take_ownership:
            case return_value_policy::automatic:
                return eigen_encapsulate<props>(src);
            case return_value_policy::move:
                return eigen_encapsulate<props>(new CType(std::move(*src)));
            case return_value_policy::copy:
                return eigen_array_cast<props>(*src);
            case return_value_policy::reference:
            case return_value_policy::automatic_reference:
                return eigen_ref_array<props>(*src);
            case return_value_policy::reference_internal:
                return eigen_ref_array<props>(*src, parent);
            default:
                throw cast_error("unhandled return_value_policy: should not happen!");
        };
    }